

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O0

void amrex::average_face_to_cellcenter(MultiFab *cc,Array<const_MultiFab_*,_3> *fc,Geometry *geom)

{
  int iVar1;
  bool bVar2;
  FabArrayBase *in_RDI;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *fzarr;
  Array4<const_double> *fyarr;
  Array4<const_double> *fxarr;
  Array4<double> *ccarr;
  Box bx;
  MFIter mfi;
  GeometryData gd;
  BARef *__n;
  MFIter *in_stack_fffffffffffffb90;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffb98;
  Geometry *in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffbb0;
  undefined1 do_tiling_;
  int *piVar3;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  int iVar4;
  int local_438;
  int local_434;
  MFIter *in_stack_fffffffffffffbf0;
  long local_3f0;
  long local_3e8;
  long local_3e0;
  int local_3d0;
  int local_3cc;
  int local_3c8;
  long *local_3b0;
  undefined1 local_3a8 [136];
  MFIter *local_320;
  undefined1 local_318 [200];
  undefined1 local_250 [136];
  FabArrayBase *local_1c8;
  MFIter *local_1c0;
  int local_1b8;
  int *local_1b0;
  int local_1a4;
  int iStack_1a0;
  int local_19c;
  undefined8 local_198;
  int local_190;
  int *local_188;
  int local_180;
  int iStack_17c;
  int local_178;
  undefined4 local_174;
  long *local_170;
  FabArray<amrex::FArrayBox> *local_168;
  MFIter *local_160;
  BARef *local_158;
  int local_14c;
  int local_148;
  int local_144;
  undefined1 *local_140;
  undefined4 local_134;
  int *local_130;
  undefined4 local_124;
  int *local_120;
  undefined4 local_114;
  int *local_110;
  undefined4 local_104;
  int *local_100;
  undefined4 local_f4;
  int *local_f0;
  undefined4 local_e4;
  int *local_e0;
  undefined4 local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  BARef *local_c8;
  undefined4 local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  BARef *local_b0;
  undefined4 local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  BARef *local_98;
  int local_8c;
  int local_88;
  int local_84;
  long *local_80;
  int local_74;
  int local_70;
  int local_6c;
  long *local_68;
  int local_5c;
  int local_58;
  int local_54;
  FabArray<amrex::FArrayBox> *local_50;
  int local_44;
  int local_40;
  int local_3c;
  FabArray<amrex::FArrayBox> *local_38;
  int local_2c;
  int local_28;
  int local_24;
  MFIter *local_20;
  int local_14;
  int local_10;
  int local_c;
  MFIter *local_8;
  
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffffbb0 >> 0x38);
  local_1c8 = in_RDI;
  Geometry::data(in_stack_fffffffffffffba0);
  local_140 = local_250;
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),local_1c8,
                 (bool)do_tiling_);
  while (bVar2 = MFIter::isValid((MFIter *)(local_318 + 0x68)), bVar2) {
    piVar3 = (int *)(local_318 + 0x4c);
    MFIter::tilebox(in_stack_fffffffffffffbf0);
    __n = (BARef *)local_318;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
    local_318._64_8_ = __n;
    std::array<const_amrex::MultiFab_*,_3UL>::operator[]
              ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffb90,(size_type)__n);
    in_stack_fffffffffffffb90 = (MFIter *)(local_3a8 + 0x48);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
    local_320 = in_stack_fffffffffffffb90;
    std::array<const_amrex::MultiFab_*,_3UL>::operator[]
              ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffb90,(size_type)__n);
    in_stack_fffffffffffffb98 = (FabArray<amrex::FArrayBox> *)local_3a8;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
    local_3a8._64_8_ = in_stack_fffffffffffffb98;
    std::array<const_amrex::MultiFab_*,_3UL>::operator[]
              ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffb90,(size_type)__n);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
    local_e4 = 0;
    local_1a4 = *piVar3;
    local_f4 = 1;
    iStack_1a0 = piVar3[1];
    in_stack_fffffffffffffbf0 = *(MFIter **)piVar3;
    local_104 = 2;
    local_1b8 = piVar3[2];
    local_110 = piVar3 + 3;
    local_114 = 0;
    local_180 = *local_110;
    local_120 = piVar3 + 3;
    local_124 = 1;
    iStack_17c = piVar3[4];
    local_198 = *(undefined8 *)local_110;
    local_130 = piVar3 + 3;
    local_134 = 2;
    local_190 = piVar3[5];
    for (local_434 = local_1b8; local_438 = iStack_1a0, local_434 <= local_190;
        local_434 = local_434 + 1) {
      for (; iVar1 = local_1a4, local_438 <= iStack_17c; local_438 = local_438 + 1) {
        while (iVar4 = iVar1, iVar4 <= local_180) {
          local_148 = local_438;
          local_14c = local_434;
          local_158 = (BARef *)local_318._64_8_;
          local_160 = local_320;
          local_168 = (FabArray<amrex::FArrayBox> *)local_3a8._64_8_;
          local_174 = 0;
          local_8 = local_320;
          local_10 = local_438;
          local_14 = local_434;
          local_20 = local_320;
          local_24 = iVar4 + 1;
          local_28 = local_438;
          local_2c = local_434;
          local_98 = (BARef *)local_318._64_8_;
          local_a0 = local_438;
          local_a4 = local_434;
          local_a8 = 0;
          *(double *)
           ((long)&((((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)local_318._64_8_)->
                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start)->smallend +
           ((long)(iVar4 - (((Box *)(local_318._64_8_ + 0x18))->smallend).vect[2]) +
            (long)(local_438 - (((Box *)(local_318._64_8_ + 0x18))->bigend).vect[0]) *
            (long)(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)local_318._64_8_)->
                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish +
           (long)(local_434 - (((Box *)(local_318._64_8_ + 0x18))->bigend).vect[1]) *
           (long)(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)local_318._64_8_)->
                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage) * 8) =
               (*(double *)
                 ((long)&((local_320->m_fa)._M_t.
                          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                          .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                         _vptr_FabArrayBase +
                 ((long)(iVar4 - local_320->currentIndex) +
                  (long)(local_438 - local_320->beginIndex) * (long)local_320->fabArray +
                 (long)(local_434 - local_320->endIndex) * *(long *)(local_320->tile_size).vect) * 8
                 ) + *(double *)
                      ((long)&((local_320->m_fa)._M_t.
                               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                              _vptr_FabArrayBase +
                      ((long)(local_24 - local_320->currentIndex) +
                       (long)(local_438 - local_320->beginIndex) * (long)local_320->fabArray +
                      (long)(local_434 - local_320->endIndex) * *(long *)(local_320->tile_size).vect
                      ) * 8)) * 0.5;
          local_38 = (FabArray<amrex::FArrayBox> *)local_3a8._64_8_;
          local_40 = local_438;
          local_44 = local_434;
          local_50 = (FabArray<amrex::FArrayBox> *)local_3a8._64_8_;
          local_58 = local_438 + 1;
          local_5c = local_434;
          local_b0 = (BARef *)local_318._64_8_;
          local_b8 = local_438;
          local_bc = local_434;
          local_c0 = 1;
          *(double *)
           ((long)&((((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)local_318._64_8_)->
                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start)->smallend +
           ((long)(iVar4 - (((Box *)(local_318._64_8_ + 0x18))->smallend).vect[2]) +
            (long)(local_438 - (((Box *)(local_318._64_8_ + 0x18))->bigend).vect[0]) *
            (long)(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)local_318._64_8_)->
                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish +
            (long)(local_434 - (((Box *)(local_318._64_8_ + 0x18))->bigend).vect[1]) *
            (long)(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)local_318._64_8_)->
                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage +
           *(long *)(((Box *)(local_318._64_8_ + 0x18))->smallend).vect) * 8) =
               (*(double *)
                 (*(long *)local_3a8._64_8_ +
                 ((long)(iVar4 - *(int *)(local_3a8._64_8_ + 0x20)) +
                  (long)(local_438 - *(int *)(local_3a8._64_8_ + 0x24)) *
                  *(long *)&((BoxArray *)(local_3a8._64_8_ + 8))->m_bat +
                 (long)(local_434 - *(int *)(local_3a8._64_8_ + 0x28)) *
                 *(long *)(local_3a8._64_8_ + 0x10)) * 8) +
               *(double *)
                (*(long *)local_3a8._64_8_ +
                ((long)(iVar4 - *(int *)(local_3a8._64_8_ + 0x20)) +
                 (long)(local_58 - *(int *)(local_3a8._64_8_ + 0x24)) *
                 *(long *)&((BoxArray *)(local_3a8._64_8_ + 8))->m_bat +
                (long)(local_434 - *(int *)(local_3a8._64_8_ + 0x28)) *
                *(long *)(local_3a8._64_8_ + 0x10)) * 8)) * 0.5;
          local_70 = local_438;
          local_74 = local_434;
          local_88 = local_438;
          local_8c = local_434 + 1;
          local_c8 = (BARef *)local_318._64_8_;
          local_d0 = local_438;
          local_d4 = local_434;
          local_d8 = 2;
          *(double *)
           ((long)&((((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)local_318._64_8_)->
                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start)->smallend +
           ((long)(iVar4 - (((Box *)(local_318._64_8_ + 0x18))->smallend).vect[2]) +
            (long)(local_438 - (((Box *)(local_318._64_8_ + 0x18))->bigend).vect[0]) *
            (long)(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)local_318._64_8_)->
                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish +
            (long)(local_434 - (((Box *)(local_318._64_8_ + 0x18))->bigend).vect[1]) *
            (long)(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)local_318._64_8_)->
                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage +
           *(long *)(((Box *)(local_318._64_8_ + 0x18))->smallend).vect * 2) * 8) =
               (*(double *)
                 (local_3f0 +
                 ((long)(iVar4 - local_3d0) + (local_438 - local_3cc) * local_3e8 +
                 (local_434 - local_3c8) * local_3e0) * 8) +
               *(double *)
                (local_3f0 +
                ((long)(iVar4 - local_3d0) + (local_438 - local_3cc) * local_3e8 +
                (local_8c - local_3c8) * local_3e0) * 8)) * 0.5;
          local_170 = &local_3f0;
          local_144 = iVar4;
          local_cc = iVar4;
          local_b4 = iVar4;
          local_9c = iVar4;
          local_84 = iVar4;
          local_80 = &local_3f0;
          local_6c = iVar4;
          local_68 = &local_3f0;
          local_54 = iVar4;
          local_3c = iVar4;
          local_c = iVar4;
          iVar1 = iVar4 + 1;
        }
      }
    }
    local_3b0 = &local_3f0;
    local_1c0 = in_stack_fffffffffffffbf0;
    local_1b0 = piVar3;
    local_19c = local_1b8;
    local_188 = piVar3;
    local_178 = local_190;
    local_100 = piVar3;
    local_f0 = piVar3;
    local_e0 = piVar3;
    MFIter::operator++((MFIter *)(local_318 + 0x68));
  }
  MFIter::~MFIter(in_stack_fffffffffffffb90);
  return;
}

Assistant:

void average_face_to_cellcenter (MultiFab& cc,
                                     const Array<const MultiFab*,AMREX_SPACEDIM>& fc,
                                     const Geometry& geom)
    {
        AMREX_ASSERT(cc.nComp() >= AMREX_SPACEDIM);
        AMREX_ASSERT(fc[0]->nComp() == 1); // We only expect fc to have the gradient perpendicular to the face

        const GeometryData gd = geom.data();
        amrex::ignore_unused(gd);

#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion() && cc.isFusingCandidate()) {
            auto const& ccma = cc.arrays();
            AMREX_D_TERM(auto const& fxma = fc[0]->const_arrays();,
                         auto const& fyma = fc[1]->const_arrays();,
                         auto const& fzma = fc[2]->const_arrays(););
            ParallelFor(cc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
            {
                amrex_avg_fc_to_cc(i,j,k, ccma[box_no], AMREX_D_DECL(fxma[box_no],
                                                                     fyma[box_no],
                                                                     fzma[box_no]),
                                   0
#if (AMREX_SPACEDIM == 1)
                                   , gd
#endif
                                   );
            });
            Gpu::streamSynchronize();
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(cc,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box bx = mfi.tilebox();
                Array4<Real> const& ccarr = cc.array(mfi);
                AMREX_D_TERM(Array4<Real const> const& fxarr = fc[0]->const_array(mfi);,
                             Array4<Real const> const& fyarr = fc[1]->const_array(mfi);,
                             Array4<Real const> const& fzarr = fc[2]->const_array(mfi););

#if (AMREX_SPACEDIM == 1)
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D( bx, i, j, k,
                {
                    amrex_avg_fc_to_cc(i,j,k, ccarr, fxarr, 0, gd);
                });
#else
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D( bx, i, j, k,
                {
                    amrex_avg_fc_to_cc(i,j,k, ccarr, AMREX_D_DECL(fxarr,fyarr,fzarr), 0);
                });
#endif
            }
        }
    }